

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O0

void __thiscall JsUtil::JobProcessor::PrioritizeManager(JobProcessor *this,JobManager *manager)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Job *first;
  JobManager *pJVar4;
  Job *first_00;
  Job *local_30;
  Job *job;
  Job *lastJob;
  Job *originalHead;
  JobManager *manager_local;
  JobProcessor *this_local;
  
  if (manager == (JobManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x109,"(manager)","manager");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((this->isClosed & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x10a,"(!isClosed)","!isClosed");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  DoublyLinkedList<JsUtil::JobManager,_Memory::ArenaAllocator>::MoveToBeginning
            (&this->managers,manager);
  if (manager->numJobsAddedToProcessor != 0) {
    first = DoublyLinkedList<JsUtil::Job,_Memory::ArenaAllocator>::Head(&this->jobs);
    job = (Job *)0x0;
    for (local_30 = DoublyLinkedList<JsUtil::Job,_Memory::ArenaAllocator>::Tail(&this->jobs);
        local_30 != (Job *)0x0;
        local_30 = DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>::Previous
                             (&local_30->
                               super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>))
    {
      pJVar4 = Job::Manager(local_30);
      if (pJVar4 == manager) {
        if (job == (Job *)0x0) {
          job = local_30;
        }
      }
      else if (job != (Job *)0x0) {
        first_00 = DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>::Next
                             (&local_30->
                               super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>);
        DoublyLinkedList<JsUtil::Job,_Memory::ArenaAllocator>::MoveSubsequenceToBeginning
                  (&this->jobs,first_00,job);
        job = (Job *)0x0;
      }
      if (local_30 == first) break;
    }
    if (job != (Job *)0x0) {
      DoublyLinkedList<JsUtil::Job,_Memory::ArenaAllocator>::MoveSubsequenceToBeginning
                (&this->jobs,first,job);
    }
  }
  return;
}

Assistant:

void JobProcessor::PrioritizeManager(JobManager *const manager)
    {
        Assert(manager);
        Assert(!isClosed);

        managers.MoveToBeginning(manager);
        if (manager->numJobsAddedToProcessor == 0)
        {
            return;
        }

        // Move this manager's jobs to the beginning too. Find sequences of this manager's jobs backwards so that their relative
        // order remains intact after the sequences are moved.
        Job *const originalHead = jobs.Head();
        Job *lastJob = 0;
        for (Job *job = jobs.Tail(); job; job = job->Previous())
        {
            if (job->Manager() == manager)
            {
                if (!lastJob)
                    lastJob = job;
            }
            else if (lastJob)
            {
                jobs.MoveSubsequenceToBeginning(job->Next(), lastJob);
                lastJob = 0;
            }

            if (job == originalHead)
            {
                break;
            }
        }
        if (lastJob)
        {
            jobs.MoveSubsequenceToBeginning(originalHead, lastJob);
        }
    }